

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isdigit.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
    TESTCASE( isdigit( '0' ) );
    TESTCASE( isdigit( '9' ) );
    TESTCASE( ! isdigit( ' ' ) );
    TESTCASE( ! isdigit( 'a' ) );
    TESTCASE( ! isdigit( '@' ) );
    return TEST_RESULTS;
}